

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# key.cpp
# Opt level: O0

ssize_t __thiscall
cppurses::Key::Press::send(Press *this,int __fd,void *__buf,size_t __n,int __flags)

{
  Widget *pWVar1;
  bool bVar2;
  int iVar3;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined4 extraout_var_01;
  undefined7 uVar4;
  undefined2 local_1c;
  char local_1a;
  Press *local_18;
  Press *this_local;
  
  local_18 = this;
  if ((*(short *)&(this->super_Event).super_Input_event.field_0x1c == 9) &&
     (bVar2 = Focus::tab_press(), bVar2)) {
    this_local._7_1_ = 1;
    uVar4 = extraout_var;
  }
  else if ((*(short *)&(this->super_Event).super_Input_event.field_0x1c == 0x161) &&
          (bVar2 = Focus::shift_tab_press(), bVar2)) {
    this_local._7_1_ = 1;
    uVar4 = extraout_var_00;
  }
  else {
    pWVar1 = (this->super_Event).super_Input_event.super_Event.receiver_;
    local_1c = *(undefined2 *)&(this->super_Event).super_Input_event.field_0x1c;
    local_1a = key_to_char(*(Code *)&(this->super_Event).super_Input_event.field_0x1c);
    iVar3 = (*pWVar1->_vptr_Widget[0x10])(pWVar1,&local_1c);
    uVar4 = (undefined7)(CONCAT44(extraout_var_01,iVar3) >> 8);
    this_local._7_1_ = (byte)iVar3 & 1;
  }
  return CONCAT71(uVar4,this_local._7_1_);
}

Assistant:

bool Key::Press::send() const {
    if (key_ == Code::Tab && Focus::tab_press()) {
        return true;
    }
    if (key_ == Code::Back_tab && Focus::shift_tab_press()) {
        return true;
    }
    return receiver_.key_press_event(Key::State{key_, key_to_char(key_)});
}